

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::flattened_access_chain_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t base,uint32_t *indices,
          uint32_t count,SPIRType *target_type,uint32_t offset,uint32_t matrix_stride,
          uint32_t param_7,bool need_transpose)

{
  bool bVar1;
  CompilerError *this_00;
  bool need_transpose_local;
  SPIRType *target_type_local;
  uint32_t count_local;
  uint32_t *indices_local;
  uint32_t base_local;
  CompilerGLSL *this_local;
  
  bVar1 = VectorView<unsigned_int>::empty(&(target_type->array).super_VectorView<unsigned_int>);
  if (!bVar1) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (this_00,"Access chains that result in an array can not be flattened");
    __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  if (target_type->basetype == Struct) {
    flattened_access_chain_struct_abi_cxx11_
              (__return_storage_ptr__,this,base,indices,count,target_type,offset);
  }
  else if (target_type->columns < 2) {
    flattened_access_chain_vector_abi_cxx11_
              (__return_storage_ptr__,this,base,indices,count,target_type,offset,matrix_stride,
               need_transpose);
  }
  else {
    flattened_access_chain_matrix_abi_cxx11_
              (__return_storage_ptr__,this,base,indices,count,target_type,offset,matrix_stride,
               need_transpose);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::flattened_access_chain(uint32_t base, const uint32_t *indices, uint32_t count,
                                                 const SPIRType &target_type, uint32_t offset, uint32_t matrix_stride,
                                                 uint32_t /* array_stride */, bool need_transpose)
{
	if (!target_type.array.empty())
		SPIRV_CROSS_THROW("Access chains that result in an array can not be flattened");
	else if (target_type.basetype == SPIRType::Struct)
		return flattened_access_chain_struct(base, indices, count, target_type, offset);
	else if (target_type.columns > 1)
		return flattened_access_chain_matrix(base, indices, count, target_type, offset, matrix_stride, need_transpose);
	else
		return flattened_access_chain_vector(base, indices, count, target_type, offset, matrix_stride, need_transpose);
}